

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParserHandlePEReference(xmlParserCtxtPtr ctxt)

{
  xmlParserCtxtPtr ctxt_local;
  
  switch(ctxt->instate) {
  case XML_PARSER_START:
  case XML_PARSER_MISC:
  case XML_PARSER_PROLOG:
    xmlFatalErr(ctxt,XML_ERR_PEREF_IN_PROLOG,(char *)0x0);
    break;
  case XML_PARSER_PI:
  case XML_PARSER_CONTENT:
  case XML_PARSER_ENTITY_DECL:
  case XML_PARSER_ATTRIBUTE_VALUE:
  case XML_PARSER_SYSTEM_LITERAL:
  case XML_PARSER_PUBLIC_LITERAL:
    break;
  case XML_PARSER_DTD:
    if ((ctxt->external == 0) && (ctxt->inputNr == 1)) {
      return;
    }
    if (ctxt->input->cur[1] == ' ') {
      return;
    }
    if ((8 < ctxt->input->cur[1]) && (ctxt->input->cur[1] < 0xb)) {
      return;
    }
    if (ctxt->input->cur[1] == '\r') {
      return;
    }
    if (ctxt->input->cur[1] == '\0') {
      return;
    }
  default:
    xmlParsePEReference(ctxt);
    break;
  case XML_PARSER_COMMENT:
    break;
  case XML_PARSER_START_TAG:
    break;
  case XML_PARSER_CDATA_SECTION:
    break;
  case XML_PARSER_END_TAG:
    break;
  case XML_PARSER_ENTITY_VALUE:
    break;
  case XML_PARSER_EPILOG:
    xmlFatalErr(ctxt,XML_ERR_PEREF_IN_EPILOG,(char *)0x0);
    break;
  case XML_PARSER_IGNORE:
    break;
  case XML_PARSER_EOF:
    xmlFatalErr(ctxt,XML_ERR_PEREF_AT_EOF,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParserHandlePEReference(xmlParserCtxtPtr ctxt) {
    switch(ctxt->instate) {
	case XML_PARSER_CDATA_SECTION:
	    return;
        case XML_PARSER_COMMENT:
	    return;
	case XML_PARSER_START_TAG:
	    return;
	case XML_PARSER_END_TAG:
	    return;
        case XML_PARSER_EOF:
	    xmlFatalErr(ctxt, XML_ERR_PEREF_AT_EOF, NULL);
	    return;
        case XML_PARSER_PROLOG:
	case XML_PARSER_START:
	case XML_PARSER_MISC:
	    xmlFatalErr(ctxt, XML_ERR_PEREF_IN_PROLOG, NULL);
	    return;
	case XML_PARSER_ENTITY_DECL:
        case XML_PARSER_CONTENT:
        case XML_PARSER_ATTRIBUTE_VALUE:
        case XML_PARSER_PI:
	case XML_PARSER_SYSTEM_LITERAL:
	case XML_PARSER_PUBLIC_LITERAL:
	    /* we just ignore it there */
	    return;
        case XML_PARSER_EPILOG:
	    xmlFatalErr(ctxt, XML_ERR_PEREF_IN_EPILOG, NULL);
	    return;
	case XML_PARSER_ENTITY_VALUE:
	    /*
	     * NOTE: in the case of entity values, we don't do the
	     *       substitution here since we need the literal
	     *       entity value to be able to save the internal
	     *       subset of the document.
	     *       This will be handled by xmlStringDecodeEntities
	     */
	    return;
        case XML_PARSER_DTD:
	    /*
	     * [WFC: Well-Formedness Constraint: PEs in Internal Subset]
	     * In the internal DTD subset, parameter-entity references
	     * can occur only where markup declarations can occur, not
	     * within markup declarations.
	     * In that case this is handled in xmlParseMarkupDecl
	     */
	    if ((ctxt->external == 0) && (ctxt->inputNr == 1))
		return;
	    if (IS_BLANK_CH(NXT(1)) || NXT(1) == 0)
		return;
            break;
        case XML_PARSER_IGNORE:
            return;
    }

    xmlParsePEReference(ctxt);
}